

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * tToTime_abi_cxx11_(string *__return_storage_ptr__,int32_t t_s)

{
  tm *__tp;
  time_t t;
  char buf [256];
  allocator<char> local_121;
  long local_120;
  char local_118 [264];
  
  local_120 = (long)t_s;
  __tp = localtime(&local_120);
  strftime(local_118,0x100,"%H:%M",__tp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_118,&local_121);
  return __return_storage_ptr__;
}

Assistant:

std::string tToTime(int32_t t_s) {
    char buf[256];
    time_t t = t_s;
    struct tm *tm = localtime(&t);
    strftime(buf, sizeof(buf), "%H:%M", tm);
    return buf;
}